

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

void __thiscall
QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *parent,int start,int end)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QModelIndex *parent_00;
  QObject *pQVar4;
  int in_EDX;
  QConcatenateTablesProxyModelPrivate *in_RSI;
  QConcatenateTablesProxyModelPrivate *in_RDI;
  long in_FS_OFFSET;
  int newColCount;
  int oldColCount;
  QAbstractItemModel *model;
  QConcatenateTablesProxyModel *q;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  QObject *in_stack_ffffffffffffff90;
  QObject *pQVar5;
  undefined4 in_stack_ffffffffffffffa0;
  int local_44 [7];
  undefined1 local_28 [28];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  parent_00 = (QModelIndex *)q_func(in_RDI);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (!bVar1) {
    pQVar4 = QObject::sender(in_stack_ffffffffffffff90);
    pQVar5 = pQVar4;
    QModelIndex::QModelIndex((QModelIndex *)0x859bbd);
    iVar2 = (*pQVar4->_vptr_QObject[0x10])(pQVar4,local_28);
    iVar3 = columnCountAfterChange
                      (in_RSI,(QAbstractItemModel *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),
                       (int)((ulong)parent_00 >> 0x20));
    if (iVar2 < iVar3) {
      QModelIndex::QModelIndex((QModelIndex *)0x859c16);
      local_44[0] = ((in_EDX + iVar3) - iVar2) + -1;
      qMin<int>(&local_c,local_44);
      QAbstractItemModel::beginInsertColumns
                ((QAbstractItemModel *)CONCAT44(in_EDX,in_stack_ffffffffffffffa0),parent_00,
                 (int)((ulong)pQVar5 >> 0x20),(int)pQVar5);
    }
    in_RDI->m_newColumnCount = iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotColumnsAboutToBeInserted(const QModelIndex &parent,
                                                                       int start, int end)
{
    Q_Q(QConcatenateTablesProxyModel);
    if (parent.isValid()) // flat model
        return;
    const QAbstractItemModel * const model = static_cast<QAbstractItemModel *>(q->sender());
    const int oldColCount = model->columnCount();
    const int newColCount = columnCountAfterChange(model, oldColCount + end - start + 1);
    Q_ASSERT(newColCount >= oldColCount);
    if (newColCount > oldColCount)
        // If the underlying models have a different number of columns (example: 2 and 3), inserting 2 columns in
        // the first model leads to inserting only one column in the proxy, since qMin(2+2,3) == 3.
        q->beginInsertColumns(QModelIndex(), start, qMin(end, start + newColCount - oldColCount - 1));
    m_newColumnCount = newColCount;
}